

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int delete(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  ulonglong uVar2;
  undefined8 uVar3;
  zip_uint64_t idx;
  char **argv_local;
  int argc_local;
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  iVar1 = zip_delete(za,uVar2);
  __stream = _stderr;
  if (iVar1 < 0) {
    uVar3 = zip_strerror(za);
    fprintf(__stream,"can\'t delete file at index \'%lu\': %s\n",uVar2,uVar3);
    argv_local._4_4_ = -1;
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int delete (int argc, char *argv[]) {
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    if (zip_delete(za, idx) < 0) {
	fprintf(stderr, "can't delete file at index '%" PRIu64 "': %s\n", idx, zip_strerror(za));
	return -1;
    }
    return 0;
}